

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_impl_opengl3.cpp
# Opt level: O0

bool CheckShader(GLuint handle,char *desc)

{
  PFNGLGETSHADERINFOLOGPROC p_Var1;
  FILE *__stream;
  GLsizei GVar2;
  char *pcVar3;
  undefined1 local_30 [8];
  ImVector<char> buf;
  GLint log_length;
  GLint status;
  char *desc_local;
  GLuint handle_local;
  
  buf.Data._4_4_ = 0;
  buf.Data._0_4_ = 0;
  (*gl3wGetShaderiv)(handle,0x8b81,(GLint *)((long)&buf.Data + 4));
  (*gl3wGetShaderiv)(handle,0x8b84,(GLint *)&buf.Data);
  if ((buf.Data._4_4_ & 0xff) == 0) {
    fprintf(_stderr,"ERROR: ImGui_ImplOpenGL3_CreateDeviceObjects: failed to compile %s!\n",desc);
  }
  if (1 < (int)buf.Data) {
    ImVector<char>::ImVector((ImVector<char> *)local_30);
    ImVector<char>::resize((ImVector<char> *)local_30,(int)buf.Data + 1);
    GVar2 = (int)buf.Data;
    p_Var1 = gl3wGetShaderInfoLog;
    pcVar3 = ImVector<char>::begin((ImVector<char> *)local_30);
    (*p_Var1)(handle,GVar2,(GLsizei *)0x0,pcVar3);
    __stream = _stderr;
    pcVar3 = ImVector<char>::begin((ImVector<char> *)local_30);
    fprintf(__stream,"%s\n",pcVar3);
    ImVector<char>::~ImVector((ImVector<char> *)local_30);
  }
  return (buf.Data._4_4_ & 0xff) == 1;
}

Assistant:

static bool CheckShader(GLuint handle, const char* desc)
{
    GLint status = 0, log_length = 0;
    glGetShaderiv(handle, GL_COMPILE_STATUS, &status);
    glGetShaderiv(handle, GL_INFO_LOG_LENGTH, &log_length);
    if ((GLboolean)status == GL_FALSE)
        fprintf(stderr, "ERROR: ImGui_ImplOpenGL3_CreateDeviceObjects: failed to compile %s!\n", desc);
    if (log_length > 1)
    {
        ImVector<char> buf;
        buf.resize((int)(log_length + 1));
        glGetShaderInfoLog(handle, log_length, NULL, (GLchar*)buf.begin());
        fprintf(stderr, "%s\n", buf.begin());
    }
    return (GLboolean)status == GL_TRUE;
}